

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O2

void __thiscall IZDeflate::gen_codes(IZDeflate *this,ct_data *tree,int max_code)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  ushort uVar4;
  ushort auStack_48 [4];
  ush next_code [16];
  
  uVar4 = 0;
  for (lVar3 = 0; lVar3 != 0xf; lVar3 = lVar3 + 1) {
    uVar4 = (uVar4 + this->bl_count[lVar3]) * 2;
    auStack_48[lVar3 + 1] = uVar4;
  }
  for (lVar3 = 0; lVar3 <= max_code; lVar3 = lVar3 + 1) {
    uVar4 = tree[lVar3].dl.dad;
    if (uVar4 != 0) {
      uVar1 = auStack_48[uVar4];
      auStack_48[uVar4] = uVar1 + 1;
      uVar2 = bi_reverse(this,(uint)uVar1,(uint)uVar4);
      tree[lVar3].fc.freq = (ush)uVar2;
    }
  }
  return;
}

Assistant:

void IZDeflate::gen_codes (ct_data near *tree, int max_code)
    // ct_data near *tree;        /* the tree to decorate */
    // int max_code;              /* largest code with non zero frequency */
{
    ush next_code[MAX_BITS+1]; /* next code value for each bit length */
    ush code = 0;              /* running code value */
    int bits;                  /* bit index */
    int n;                     /* code index */

    /* The distribution counts are first used to generate the code values
     * without bit reversal.
     */
    for (bits = 1; bits <= MAX_BITS; bits++) {
        next_code[bits] = code = (ush)((code + bl_count[bits-1]) << 1);
    }
    /* Check that the bit counts in bl_count are consistent. The last code
     * must be all ones.
     */
    Assert(code + bl_count[MAX_BITS]-1 == (1<< ((ush) MAX_BITS)) - 1,
            "inconsistent bit counts");
    Tracev((stderr,"\ngen_codes: max_code %d ", max_code));

    for (n = 0;  n <= max_code; n++) {
        int len = tree[n].Len;
        if (len == 0) continue;
        /* Now reverse the bits */
        tree[n].Code = (ush)bi_reverse(next_code[len]++, len);

        Tracec(tree != static_ltree, (stderr,"\nn %3d %c l %2d c %4x (%x) ",
             n, (isgraph(n) ? n : ' '), len, tree[n].Code, next_code[len]-1));
    }
}